

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_2_5::anon_unknown_18::jacobiRotateRight<double>
               (Matrix44<double> *A,int j,int k,double c,double s)

{
  double dVar1;
  double dVar2;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 0x20) {
    dVar1 = *(double *)((long)A->x[0] + lVar3 + (ulong)(uint)j * 8);
    dVar2 = *(double *)((long)A->x[0] + lVar3 + (ulong)(uint)k * 8);
    *(double *)((long)A->x[0] + lVar3 + (ulong)(uint)j * 8) = c * dVar1 - dVar2 * s;
    *(double *)((long)A->x[0] + lVar3 + (ulong)(uint)k * 8) = dVar1 * s + dVar2 * c;
  }
  return;
}

Assistant:

void
jacobiRotateRight (IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
                   const int j,
                   const int k,
                   const T c,
                   const T s)
{
    for (int i = 0; i < 4; ++i)
    {
        const T tau1 = A[i][j];
        const T tau2 = A[i][k];
        A[i][j] = c * tau1 - s * tau2;
        A[i][k] = s * tau1 + c * tau2;
    }
}